

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListDelete(sqlite3 *db,SrcList *pList)

{
  SrcItem *local_28;
  SrcItem *pItem;
  int i;
  SrcList *pList_local;
  sqlite3 *db_local;
  
  if (pList != (SrcList *)0x0) {
    local_28 = pList->a;
    for (pItem._4_4_ = 0; pItem._4_4_ < pList->nSrc; pItem._4_4_ = pItem._4_4_ + 1) {
      if (local_28->zDatabase != (char *)0x0) {
        sqlite3DbNNFreeNN(db,local_28->zDatabase);
      }
      if (local_28->zName != (char *)0x0) {
        sqlite3DbNNFreeNN(db,local_28->zName);
      }
      if (local_28->zAlias != (char *)0x0) {
        sqlite3DbNNFreeNN(db,local_28->zAlias);
      }
      if ((*(ushort *)&(local_28->fg).field_0x1 >> 1 & 1) != 0) {
        sqlite3DbFree(db,(local_28->u1).zIndexedBy);
      }
      if ((*(ushort *)&(local_28->fg).field_0x1 >> 2 & 1) != 0) {
        sqlite3ExprListDelete(db,(local_28->u1).pFuncArg);
      }
      sqlite3DeleteTable(db,local_28->pTab);
      if (local_28->pSelect != (Select *)0x0) {
        sqlite3SelectDelete(db,local_28->pSelect);
      }
      if ((*(ushort *)&(local_28->fg).field_0x1 >> 10 & 1) == 0) {
        if ((local_28->u3).pOn != (Expr *)0x0) {
          sqlite3ExprDelete(db,(local_28->u3).pOn);
        }
      }
      else {
        sqlite3IdListDelete(db,(local_28->u3).pUsing);
      }
      local_28 = local_28 + 1;
    }
    sqlite3DbNNFreeNN(db,pList);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListDelete(sqlite3 *db, SrcList *pList){
  int i;
  SrcItem *pItem;
  assert( db!=0 );
  if( pList==0 ) return;
  for(pItem=pList->a, i=0; i<pList->nSrc; i++, pItem++){
    if( pItem->zDatabase ) sqlite3DbNNFreeNN(db, pItem->zDatabase);
    if( pItem->zName ) sqlite3DbNNFreeNN(db, pItem->zName);
    if( pItem->zAlias ) sqlite3DbNNFreeNN(db, pItem->zAlias);
    if( pItem->fg.isIndexedBy ) sqlite3DbFree(db, pItem->u1.zIndexedBy);
    if( pItem->fg.isTabFunc ) sqlite3ExprListDelete(db, pItem->u1.pFuncArg);
    sqlite3DeleteTable(db, pItem->pTab);
    if( pItem->pSelect ) sqlite3SelectDelete(db, pItem->pSelect);
    if( pItem->fg.isUsing ){
      sqlite3IdListDelete(db, pItem->u3.pUsing);
    }else if( pItem->u3.pOn ){
      sqlite3ExprDelete(db, pItem->u3.pOn);
    }
  }
  sqlite3DbNNFreeNN(db, pList);
}